

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O3

void BinarySink_put_mp_ssh2_from_string(BinarySink *bs,ptrlen str)

{
  size_t sVar1;
  size_t sVar2;
  void *data;
  void *pvVar3;
  size_t val;
  
  sVar2 = str.len;
  pvVar3 = str.ptr;
  if (sVar2 == 0) {
    val = 0;
    data = pvVar3;
  }
  else {
    data = (void *)((long)pvVar3 + sVar2);
    val = 0;
    sVar1 = 0;
    do {
      if (*(char *)((long)pvVar3 + sVar1) != '\0') {
        val = sVar2 - sVar1;
        data = (void *)((long)pvVar3 + sVar1);
        if (*(char *)((long)pvVar3 + sVar1) < '\0') {
          BinarySink_put_uint32(bs->binarysink_,(sVar2 - sVar1) + 1);
          BinarySink_put_byte(bs->binarysink_,'\0');
          goto LAB_00113b86;
        }
        break;
      }
      sVar1 = sVar1 + 1;
    } while (sVar2 != sVar1);
  }
  BinarySink_put_uint32(bs->binarysink_,val);
LAB_00113b86:
  BinarySink_put_data(bs->binarysink_,data,val);
  return;
}

Assistant:

void BinarySink_put_mp_ssh2_from_string(BinarySink *bs, ptrlen str)
{
    const unsigned char *bytes = (const unsigned char *)str.ptr;
    size_t nbytes = str.len;
    while (nbytes > 0 && bytes[0] == 0) {
        nbytes--;
        bytes++;
    }
    if (nbytes > 0 && bytes[0] & 0x80) {
        put_uint32(bs, nbytes + 1);
        put_byte(bs, 0);
    } else {
        put_uint32(bs, nbytes);
    }
    put_data(bs, bytes, nbytes);
}